

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O1

void FastPForLib::Simple16<false>::unpack4_1_3_8(uint32_t **out,uint32_t **in)

{
  uint *puVar1;
  uint *puVar2;
  
  puVar1 = *out;
  puVar2 = *in;
  *puVar1 = *(byte *)((long)puVar2 + 3) & 0xf;
  puVar1[1] = *puVar2 >> 0x15 & 7;
  puVar1[2] = *puVar2 >> 0x12 & 7;
  puVar1[3] = *puVar2 >> 0xf & 7;
  puVar1[4] = *puVar2 >> 0xc & 7;
  puVar1[5] = *puVar2 >> 9 & 7;
  puVar1[6] = *puVar2 >> 6 & 7;
  puVar1[7] = *puVar2 >> 3 & 7;
  puVar1[8] = *puVar2 & 7;
  *in = puVar2 + 1;
  *out = puVar1 + 9;
  return;
}

Assistant:

void Simple16<MarkLength>::unpack4_1_3_8(uint32_t **out, const uint32_t **in) {
  uint32_t *pout;
  const uint32_t *pin;

  pout = *out;
  pin = *in;

  pout[0] = (pin[0] >> 24) & 0x0f;

  pout[1] = (pin[0] >> 21) & 0x07;
  pout[2] = (pin[0] >> 18) & 0x07;
  pout[3] = (pin[0] >> 15) & 0x07;
  pout[4] = (pin[0] >> 12) & 0x07;
  pout[5] = (pin[0] >> 9) & 0x07;
  pout[6] = (pin[0] >> 6) & 0x07;
  pout[7] = (pin[0] >> 3) & 0x07;
  pout[8] = pin[0] & 0x07;

  *in = pin + 1;
  *out = pout + 9;
}